

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O3

bool cmBlockCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  long *plVar1;
  pointer ppVar2;
  cmMakefile *m;
  bool bVar3;
  int iVar4;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> tVar5;
  PolicyPushPop *this;
  VariablePushPop *this_00;
  offset_in_Arguments_to_MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RCX;
  size_type __rlen;
  ulong uVar6;
  undefined4 uVar7;
  undefined8 unaff_R12;
  pointer __p;
  ulong uVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  static_string_view name;
  static_string_view name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  Arguments parsedArgs;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_1a0;
  undefined4 local_194;
  __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
  *local_190;
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [24];
  _Any_data _Stack_130;
  _Manager_type p_Stack_120;
  _Invoker_type local_118;
  undefined1 auStack_110 [24];
  _Manager_type local_f8;
  pointer ppStack_f0;
  pointer local_e8;
  pointer ppStack_e0;
  undefined1 local_d0 [16];
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  size_t local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  char local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  _Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false> local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  if ((cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_e8 = (pointer)0x0;
    ppStack_e0 = (pointer)0x0;
    local_f8 = (_Manager_type)0x0;
    ppStack_f0 = (pointer)0x0;
    auStack_110._8_8_ = 0;
    auStack_110._16_8_ = 0;
    local_118 = (_Invoker_type)0x0;
    auStack_110._0_8_ = (void *)0x0;
    _Stack_130._8_8_ = 0;
    p_Stack_120 = (_Manager_type)0x0;
    local_148._16_8_ = (pointer)0x0;
    _Stack_130._M_unused._M_object = (void *)0x0;
    local_148._0_8_ = (ActionMap *)0x0;
    local_148._8_8_ = (pointer)0x0;
    name.super_string_view._M_str = "SCOPE_FOR";
    name.super_string_view._M_len = 9;
    cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_148,name,in_RCX);
    name_00.super_string_view._M_str = "PROPAGATE";
    name_00.super_string_view._M_len = 9;
    cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_148,name_00,in_RCX);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&cmBlockCommand::parser,(ActionMap *)local_148);
    ArgumentParser::Base::~Base((Base *)local_148);
    __cxa_atexit(ArgumentParser::Base::~Base,&cmBlockCommand::parser,&__dso_handle);
    __cxa_guard_release(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_148._16_8_ = local_168;
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = (pointer)0x0;
  local_168._16_8_ = (pointer)0x0;
  local_b8 = (_Base_ptr)(local_d0 + 8);
  local_d0._8_4_ = _S_red;
  local_c0 = (_Base_ptr)0x0;
  local_a8 = 0;
  local_88 = '\0';
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._0_8_ = &cmBlockCommand::parser;
  local_148._8_8_ = local_d0;
  _Stack_130._8_8_ = (long *)0x0;
  p_Stack_120 = (_Manager_type)0x0;
  local_118 = (_Invoker_type)0x0;
  auStack_110._0_8_ = (undefined1 *)0x0;
  auStack_110._8_8_ = 0;
  auStack_110._16_8_ = 0;
  local_f8 = (_Manager_type)0x0;
  ppStack_f0 = (pointer)0x0;
  local_e8 = (pointer)((ulong)local_e8 & 0xffffffffffffff00);
  _Stack_130._M_unused._0_8_ = (undefined8)local_148._8_8_;
  local_b0 = local_b8;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)local_148,args,0);
  if (local_f8 != (_Manager_type)0x0) {
    (*local_f8)((_Any_data *)(auStack_110 + 8),(_Any_data *)(auStack_110 + 8),__destroy_functor);
  }
  if (local_168._0_8_ == local_168._8_8_) {
    bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_d0,status->Makefile);
    if (bVar3) {
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    else {
      if (local_88 == '\x01') {
        uVar8 = 0;
        if (local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            plVar1 = (long *)((local_a0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
            ppVar2 = (pointer)(local_a0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
            if (ppVar2 == (pointer)0x8) {
              uVar6 = 2;
              if (*plVar1 != 0x53454943494c4f50) {
LAB_003e3bf6:
                local_148._0_8_ = (ActionMap *)0x1d;
                local_148._8_8_ = "SCOPE_FOR unsupported scope \"";
                local_148._16_8_ = (pointer)0x0;
                p_Stack_120 = (_Manager_type)0x0;
                auStack_110._0_8_ = local_50;
                local_68._M_head_impl = (PolicyPushPop *)0x0;
                local_60 = 1;
                local_50[0] = 0x22;
                local_118 = (_Invoker_type)0x1;
                auStack_110._8_8_ = 0;
                views_00._M_len = 3;
                views_00._M_array = (iterator)local_148;
                _Stack_130._M_unused._M_object = ppVar2;
                _Stack_130._8_8_ = plVar1;
                local_58 = (undefined1 *)auStack_110._0_8_;
                cmCatViews((string *)local_188,views_00);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_003e38da;
              }
            }
            else if ((ppVar2 != (pointer)&DAT_00000009) ||
                    (uVar6 = 1, (char)plVar1[1] != 'S' || *plVar1 != 0x454c424149524156))
            goto LAB_003e3bf6;
            uVar8 = uVar8 | uVar6;
            local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          } while (local_a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          if ((uVar8 & 1) != 0) goto LAB_003e3a20;
        }
        if (local_80.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_80.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_148._0_8_ = (ActionMap *)(local_148 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_148,
                     "PROPAGATE cannot be specified without a new scope for VARIABLES","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_188._16_8_ = local_148._16_8_;
          local_188._0_8_ = local_148._0_8_;
          if ((ActionMap *)local_148._0_8_ != (ActionMap *)(local_148 + 0x10)) goto LAB_003e38ed;
          goto LAB_003e38f5;
        }
        uVar7 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      }
      else {
        uVar8 = 3;
LAB_003e3a20:
        uVar7 = 0;
      }
      m = status->Makefile;
      tVar5.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           operator_new(0xd0);
      local_194 = uVar7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148,&local_80);
      *(long **)((long)tVar5.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8) =
           (long *)((long)tVar5.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18);
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x10) = 0;
      *(undefined1 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18) = 0;
      *(long **)((long)tVar5.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x28) =
           (long *)((long)tVar5.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38);
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x30) = 0;
      *(undefined1 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x48) = 0;
      *(undefined1 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x70) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x78) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x80) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x88) = 0;
      *(undefined4 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x90) = 1;
      *(undefined ***)
       tVar5.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
       super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           &PTR__cmBlockFunctionBlocker_00b1d128;
      *(cmMakefile **)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98) = m;
      *(ulong *)((long)tVar5.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0) =
           uVar8;
      local_190 = (__uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                   *)((long)tVar5.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8);
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0) = 0;
      if ((uVar8 & 2) != 0) {
        this = (PolicyPushPop *)operator_new(8);
        cmMakefile::PolicyPushPop::PolicyPushPop(this,m);
        local_68._M_head_impl = (PolicyPushPop *)0x0;
        std::
        __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::reset(local_190,this);
        std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::~unique_ptr((unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                       *)&local_68);
      }
      if ((char)local_194 == '\0') {
        this_00 = (VariablePushPop *)operator_new(8);
        cmMakefile::VariablePushPop::VariablePushPop(this_00,m);
        local_68._M_head_impl = (PolicyPushPop *)0x0;
        std::
        __uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
        ::reset((__uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                 *)((long)tVar5.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0),
                this_00);
        std::
        unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>::
        ~unique_ptr((unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                     *)&local_68);
      }
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) =
           local_148._0_8_;
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xc0) =
           local_148._8_8_;
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 200) =
           local_148._16_8_;
      local_148._0_8_ = (ActionMap *)0x0;
      local_148._8_8_ = (pointer)0x0;
      local_148._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      local_1a0._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           tVar5.
           super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
           super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      cmMakefile::AddFunctionBlocker
                (status->Makefile,
                 (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                 &local_1a0);
      if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
          local_1a0._M_t.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0
         ) {
        (**(code **)(*(long *)local_1a0._M_t.
                              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                              .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
                  ();
      }
      local_1a0._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)0x0;
    }
    bVar3 = true;
  }
  else {
    local_148._0_8_ = (ActionMap *)0x22;
    local_148._8_8_ = "called with unsupported argument \"";
    local_148._16_8_ = (pointer)0x0;
    _Stack_130._8_8_ = ((_Alloc_hider *)local_168._0_8_)->_M_p;
    _Stack_130._M_unused._0_8_ = (undefined8)*(size_type *)(local_168._0_8_ + 8);
    p_Stack_120 = (_Manager_type)0x0;
    auStack_110._0_8_ = local_50;
    local_68._M_head_impl = (PolicyPushPop *)0x0;
    local_60 = 1;
    local_50[0] = 0x22;
    local_118 = (_Invoker_type)0x1;
    auStack_110._8_8_ = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_148;
    local_58 = (undefined1 *)auStack_110._0_8_;
    cmCatViews((string *)local_188,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003e38da:
    if ((ActionMap *)local_188._0_8_ != (ActionMap *)(local_188 + 0x10)) {
LAB_003e38ed:
      operator_delete((void *)local_188._0_8_,
                      (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&((pointer)local_188._16_8_)->first)->_M_impl).
                                     super__Vector_impl_data._M_start + 1));
    }
LAB_003e38f5:
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar3 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  if (local_88 == '\x01') {
    local_88 = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  return bVar3;
}

Assistant:

bool cmBlockCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>> ScopeFor;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Propagate;
  };
  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("SCOPE_FOR"_s, &Arguments::ScopeFor)
                               .Bind("PROPAGATE"_s, &Arguments::Propagate);
  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs = parser.Parse(args, &unrecognizedArguments);

  if (!unrecognizedArguments.empty()) {
    status.SetError(cmStrCat("called with unsupported argument \"",
                             unrecognizedArguments[0], '"'));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  ScopeSet scopes;

  if (parsedArgs.ScopeFor) {
    for (auto const& scope : *parsedArgs.ScopeFor) {
      if (scope == "VARIABLES"_s) {
        scopes.insert(ScopeType::VARIABLES);
        continue;
      }
      if (scope == "POLICIES"_s) {
        scopes.insert(ScopeType::POLICIES);
        continue;
      }
      status.SetError(cmStrCat("SCOPE_FOR unsupported scope \"", scope, '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    scopes = { ScopeType::VARIABLES, ScopeType::POLICIES };
  }
  if (!scopes.contains(ScopeType::VARIABLES) &&
      !parsedArgs.Propagate.empty()) {
    status.SetError(
      "PROPAGATE cannot be specified without a new scope for VARIABLES");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // create a function blocker
  auto fb = cm::make_unique<cmBlockFunctionBlocker>(
    &status.GetMakefile(), scopes, parsedArgs.Propagate);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}